

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O1

int getVertexCopy(Vertex *vertex,btAlignedObjectArray<btConvexHullInternal::Vertex_*> *vertices)

{
  int iVar1;
  Vertex **ppVVar2;
  long lVar3;
  int sz;
  int iVar4;
  int iVar5;
  
  iVar4 = vertex->copy;
  if (iVar4 < 0) {
    iVar4 = vertices->m_size;
    vertex->copy = iVar4;
    if (iVar4 == vertices->m_capacity) {
      iVar5 = 1;
      if (iVar4 != 0) {
        iVar5 = iVar4 * 2;
      }
      if (vertices->m_capacity < iVar5) {
        if (iVar5 == 0) {
          ppVVar2 = (Vertex **)0x0;
        }
        else {
          ppVVar2 = (Vertex **)btAlignedAllocInternal((long)iVar5 << 3,0x10);
        }
        iVar1 = vertices->m_size;
        if (0 < (long)iVar1) {
          lVar3 = 0;
          do {
            ppVVar2[lVar3] = vertices->m_data[lVar3];
            lVar3 = lVar3 + 1;
          } while (iVar1 != lVar3);
        }
        if (vertices->m_data != (Vertex **)0x0) {
          if (vertices->m_ownsMemory == true) {
            btAlignedFreeInternal(vertices->m_data);
          }
          vertices->m_data = (Vertex **)0x0;
        }
        vertices->m_ownsMemory = true;
        vertices->m_data = ppVVar2;
        vertices->m_capacity = iVar5;
      }
    }
    iVar5 = vertices->m_size;
    vertices->m_data[iVar5] = vertex;
    vertices->m_size = iVar5 + 1;
  }
  return iVar4;
}

Assistant:

static int getVertexCopy(btConvexHullInternal::Vertex* vertex, btAlignedObjectArray<btConvexHullInternal::Vertex*>& vertices)
{
	int index = vertex->copy;
	if (index < 0)
	{
		index = vertices.size();
		vertex->copy = index;
		vertices.push_back(vertex);
#ifdef DEBUG_CONVEX_HULL
		printf("Vertex %d gets index *%d\n", vertex->point.index, index);
#endif
	}
	return index;
}